

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

int Amap_LibCompareGatesByArea(Amap_Gat_t **pp1,Amap_Gat_t **pp2)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = (*pp1)->dArea - (*pp2)->dArea;
  uVar1 = 0xffffffff;
  if (0.0 <= dVar2) {
    uVar1 = (uint)(0.0 < dVar2);
  }
  return uVar1;
}

Assistant:

int Amap_LibCompareGatesByArea( Amap_Gat_t ** pp1, Amap_Gat_t ** pp2 )
{
    double Diff = (*pp1)->dArea - (*pp2)->dArea;
    if ( Diff < 0.0 )
        return -1;
    if ( Diff > 0.0 ) 
        return 1;
    return 0; 
}